

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeCol
          (SPxSolverBase<double> *this,int i,LPColBase<double> *newCol,bool scale)

{
  byte bVar1;
  SPxStatus SVar2;
  byte in_CL;
  int in_ESI;
  SPxSolverBase<double> *in_RDI;
  bool in_stack_0000004f;
  LPColBase<double> *in_stack_00000050;
  int in_stack_0000005c;
  SPxLPBase<double> *in_stack_00000060;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  if (-1 < in_ESI) {
    forceRecompNonbasicValue(in_RDI);
    SPxLPBase<double>::changeCol
              (in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_0000004f);
    SVar2 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
    if (NO_PROBLEM < SVar2) {
      SPxBasisBase<double>::changedCol
                ((SPxBasisBase<double> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                 (int)((ulong)in_RDI >> 0x20));
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeCol(int i, const LPColBase<R>& newCol, bool scale)
{
   if(i < 0)
      return;

   forceRecompNonbasicValue();

   SPxLPBase<R>::changeCol(i, newCol, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      SPxBasisBase<R>::changedCol(i);

   unInit();
}